

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O2

Adj * Omega_h::find_coarsen_domains
                (Adj *__return_storage_ptr__,Mesh *mesh,LOs *keys2verts,Int ent_dim,
                Read<signed_char> *ents_are_dead)

{
  Alloc *pAVar1;
  size_t sVar2;
  LOs lke2ke;
  LOs ke2e;
  Write<signed_char> local_280;
  Write<signed_char> local_270;
  Write<int> local_260;
  Write<int> local_250;
  Write<int> local_240;
  Write<int> local_230;
  Write<int> local_220;
  LOs k2lke;
  Write<int> local_200;
  Write<int> local_1f0;
  Write<int> lke2e;
  Write<signed_char> local_1d0;
  Write<int> local_1c0;
  Write<signed_char> lke_codes;
  Write<int> local_1a0;
  Write<int> local_190;
  Write<int> lke2k;
  Write<signed_char> local_170;
  Write<signed_char> local_160;
  Write<signed_char> local_150;
  Write<int> local_140;
  Write<signed_char> kes_are_live;
  Write<signed_char> local_120;
  Read<signed_char> ents_are_live;
  Write<int> local_100;
  LOs ke2k;
  Read<signed_char> ke_codes;
  LOs k2ke;
  Write<int> local_c0;
  Adj k2e;
  Adj local_80;
  Adj v2e;
  
  pAVar1 = (keys2verts->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  Mesh::ask_up(&v2e,mesh,0,ent_dim);
  Write<int>::Write(&local_c0,&keys2verts->write_);
  Adj::Adj(&local_80,&v2e);
  unmap_adjacency(&k2e,(LOs *)&local_c0,&local_80);
  Adj::~Adj(&local_80);
  Write<int>::~Write(&local_c0);
  Write<int>::Write(&k2ke.write_,(Write<int> *)&k2e);
  Write<int>::Write(&ke2e.write_,&k2e.super_Graph.ab2b.write_);
  Write<signed_char>::Write(&ke_codes.write_,&k2e.codes.write_);
  Write<int>::Write(&local_100,&k2ke.write_);
  invert_fan((Omega_h *)&ke2k,(LOs *)&local_100);
  Write<int>::~Write(&local_100);
  Write<signed_char>::Write(&local_120,&ents_are_dead->write_);
  invert_marks((Omega_h *)&ents_are_live,(Read<signed_char> *)&local_120);
  Write<signed_char>::~Write(&local_120);
  Write<int>::Write(&local_140,&ke2e.write_);
  Write<signed_char>::Write(&local_150,&ents_are_live.write_);
  unmap<signed_char>((Omega_h *)&kes_are_live,(LOs *)&local_140,(Read<signed_char> *)&local_150,1);
  Write<signed_char>::~Write(&local_150);
  Write<int>::~Write(&local_140);
  Write<signed_char>::Write(&local_170,&kes_are_live);
  Read<signed_char>::Read((Read<signed_char> *)&local_160,&local_170);
  collect_marked((Omega_h *)&lke2ke,(Read<signed_char> *)&local_160);
  Write<signed_char>::~Write(&local_160);
  Write<signed_char>::~Write(&local_170);
  Write<int>::Write(&local_190,&lke2ke.write_);
  Write<int>::Write(&local_1a0,&ke2k.write_);
  unmap<int>((Omega_h *)&lke2k,(LOs *)&local_190,(Read<int> *)&local_1a0,1);
  Write<int>::~Write(&local_1a0);
  Write<int>::~Write(&local_190);
  Write<int>::Write(&local_1c0,&lke2ke.write_);
  Write<signed_char>::Write(&local_1d0,&ke_codes.write_);
  unmap<signed_char>((Omega_h *)&lke_codes,(LOs *)&local_1c0,(Read<signed_char> *)&local_1d0,1);
  Write<signed_char>::~Write(&local_1d0);
  Write<int>::~Write(&local_1c0);
  Write<int>::Write(&local_1f0,&lke2ke.write_);
  Write<int>::Write(&local_200,&ke2e.write_);
  unmap<int>((Omega_h *)&lke2e,(LOs *)&local_1f0,(Read<int> *)&local_200,1);
  Write<int>::~Write(&local_200);
  Write<int>::~Write(&local_1f0);
  Write<int>::Write(&local_230,&lke2k);
  Read<int>::Read((Read<signed_char> *)&local_220,&local_230);
  invert_funnel((Omega_h *)&k2lke,(LOs *)&local_220,(LO)(sVar2 >> 2));
  Write<int>::~Write(&local_220);
  Write<int>::~Write(&local_230);
  Write<int>::Write(&local_240,&k2lke.write_);
  Write<int>::Write(&local_260,&lke2e);
  Read<int>::Read((Read<signed_char> *)&local_250,&local_260);
  Write<signed_char>::Write(&local_280,&lke_codes);
  Read<signed_char>::Read((Read<signed_char> *)&local_270,&local_280);
  Adj::Adj(__return_storage_ptr__,(LOs *)&local_240,(LOs *)&local_250,
           (Read<signed_char> *)&local_270);
  Write<signed_char>::~Write(&local_270);
  Write<signed_char>::~Write(&local_280);
  Write<int>::~Write(&local_250);
  Write<int>::~Write(&local_260);
  Write<int>::~Write(&local_240);
  Write<int>::~Write(&k2lke.write_);
  Write<int>::~Write(&lke2e);
  Write<signed_char>::~Write(&lke_codes);
  Write<int>::~Write(&lke2k);
  Write<int>::~Write(&lke2ke.write_);
  Write<signed_char>::~Write(&kes_are_live);
  Write<signed_char>::~Write(&ents_are_live.write_);
  Write<int>::~Write(&ke2k.write_);
  Write<signed_char>::~Write(&ke_codes.write_);
  Write<int>::~Write(&ke2e.write_);
  Write<int>::~Write(&k2ke.write_);
  Adj::~Adj(&k2e);
  Adj::~Adj(&v2e);
  return __return_storage_ptr__;
}

Assistant:

Adj find_coarsen_domains(
    Mesh* mesh, LOs keys2verts, Int ent_dim, Read<I8> ents_are_dead) {
  auto nkeys = keys2verts.size();
  auto v2e = mesh->ask_up(VERT, ent_dim);
  auto k2e = unmap_adjacency(keys2verts, v2e);
  auto k2ke = k2e.a2ab;
  auto ke2e = k2e.ab2b;
  auto ke_codes = k2e.codes;
  auto ke2k = invert_fan(k2ke);
  auto ents_are_live = invert_marks(ents_are_dead);
  auto kes_are_live = unmap(ke2e, ents_are_live, 1);
  auto lke2ke = collect_marked(kes_are_live);
  auto lke2k = unmap(lke2ke, ke2k, 1);
  auto lke_codes = unmap(lke2ke, ke_codes, 1);
  auto lke2e = unmap(lke2ke, ke2e, 1);
  auto k2lke = invert_funnel(lke2k, nkeys);
  return Adj(k2lke, lke2e, lke_codes);
}